

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  key_type kVar2;
  key_type kVar3;
  value_type this_00;
  key_type assertion_result;
  reference expression_text;
  value_type expected_predicate_value;
  size_type sVar4;
  value_type this_01;
  key_type kVar5;
  reference file;
  char *pcVar6;
  HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  bool *success;
  long in_RDI;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  TypeParam ht_in;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FILE *fp;
  int i;
  TypeParam ht_out;
  HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff958;
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff960;
  int index;
  HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff968;
  hasher *in_stack_fffffffffffff970;
  char *in_stack_fffffffffffff978;
  int line;
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff980;
  undefined8 in_stack_fffffffffffff988;
  Type TVar7;
  AssertHelper *in_stack_fffffffffffff990;
  char *in_stack_fffffffffffff9c0;
  char *in_stack_fffffffffffff9c8;
  char *in_stack_fffffffffffff9d0;
  AssertionResult *in_stack_fffffffffffff9d8;
  AssertHelper *in_stack_fffffffffffff9e0;
  string local_5b8 [52];
  key_type local_584;
  undefined1 local_579;
  AssertionResult local_578;
  value_type *in_stack_fffffffffffffa98;
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffaa0;
  AssertionResult local_528 [2];
  key_type local_508;
  value_type local_4b0;
  AssertionResult local_4a8;
  string local_498 [52];
  key_type local_464;
  undefined1 local_459;
  AssertionResult local_458 [2];
  key_type local_438;
  value_type local_3e0;
  AssertionResult local_3d8 [2];
  key_type local_3b8;
  value_type local_360;
  AssertionResult local_358;
  string local_348 [55];
  undefined1 local_311;
  AssertionResult local_310;
  string local_300 [55];
  undefined1 local_2c9;
  AssertionResult local_2c8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_2b8 [2];
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_290;
  string local_1f0 [55];
  undefined1 local_1b9;
  AssertionResult local_1b8;
  string local_1a8 [55];
  undefined1 local_171;
  AssertionResult local_170;
  FILE *local_160;
  key_type local_158;
  key_type local_150;
  value_type local_f0;
  int local_e8;
  key_type local_e4;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_d0 [2];
  BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_a8;
  
  bVar1 = google::
          HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff960,
               (int)((ulong)in_stack_fffffffffffff958 >> 0x20));
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff960,
               (int)((ulong)in_stack_fffffffffffff958 >> 0x20));
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_d0,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashSet
              (in_stack_fffffffffffff980,(size_type)in_stack_fffffffffffff978,
               in_stack_fffffffffffff970,(key_equal *)in_stack_fffffffffffff968,
               (allocator_type *)in_stack_fffffffffffff960);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_d0);
    local_e4 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(in_stack_fffffffffffff968,(int)((ulong)in_stack_fffffffffffff960 >> 0x20)
                          );
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key(in_stack_fffffffffffff960,(key_type *)in_stack_fffffffffffff958);
    for (local_e8 = 1; TVar7 = (Type)((ulong)in_stack_fffffffffffff988 >> 0x20), local_e8 < 100;
        local_e8 = local_e8 + 1) {
      local_f0 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ::UniqueObject(in_stack_fffffffffffff958,0);
      google::
      BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
    }
    kVar2 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff968,(int)((ulong)in_stack_fffffffffffff960 >> 0x20));
    local_150 = kVar2;
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffff960,(key_type *)in_stack_fffffffffffff958);
    kVar3 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff968,(int)((ulong)in_stack_fffffffffffff960 >> 0x20));
    local_158 = kVar3;
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffff960,(key_type *)in_stack_fffffffffffff958);
    local_160 = tmpfile();
    local_171 = local_160 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff960,(bool *)in_stack_fffffffffffff958,
               (type *)0xf52adb);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_170);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff990);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                 in_stack_fffffffffffff9c0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff990,TVar7,(char *)in_stack_fffffffffffff980,
                 (int)((ulong)in_stack_fffffffffffff978 >> 0x20),(char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffff9e0,(Message *)in_stack_fffffffffffff9d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      std::__cxx11::string::~string(local_1a8);
      testing::Message::~Message((Message *)0xf52b9e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf52c32);
    local_1b9 = google::
                BaseHashtableInterface<google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
                ::serialize<ValueSerializer,_IO_FILE>(&local_a8,local_160);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff960,(bool *)in_stack_fffffffffffff958,
               (type *)0xf52c79);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff990);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                 in_stack_fffffffffffff9c0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff990,TVar7,(char *)in_stack_fffffffffffff980,
                 (int)((ulong)in_stack_fffffffffffff978 >> 0x20),(char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffff9e0,(Message *)in_stack_fffffffffffff9d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      std::__cxx11::string::~string(local_1f0);
      testing::Message::~Message((Message *)0xf52d4e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf52de5);
    rewind(local_160);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff960,
               (int)((ulong)in_stack_fffffffffffff958 >> 0x20));
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffff960,
               (int)((ulong)in_stack_fffffffffffff958 >> 0x20));
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_2b8,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashSet
              (in_stack_fffffffffffff980,(size_type)in_stack_fffffffffffff978,
               in_stack_fffffffffffff970,(key_equal *)in_stack_fffffffffffff968,
               (allocator_type *)in_stack_fffffffffffff960);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_2b8);
    local_2c9 = local_160 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff960,(bool *)in_stack_fffffffffffff958,
               (type *)0xf52e8d);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff990);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                 in_stack_fffffffffffff9c0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff990,TVar7,(char *)in_stack_fffffffffffff980,
                 (int)((ulong)in_stack_fffffffffffff978 >> 0x20),(char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffff9e0,(Message *)in_stack_fffffffffffff9d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      std::__cxx11::string::~string(local_300);
      testing::Message::~Message((Message *)0xf52fa1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf53035);
    local_311 = google::
                BaseHashtableInterface<google::sparse_hash_set<std::pair<int,int>,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
                ::unserialize<ValueSerializer,_IO_FILE>(&local_290,local_160);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff960,(bool *)in_stack_fffffffffffff958,
               (type *)0xf5307c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_310);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff990);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                 in_stack_fffffffffffff9c0);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff990,TVar7,(char *)in_stack_fffffffffffff980,
                 (int)((ulong)in_stack_fffffffffffff978 >> 0x20),(char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffff9e0,(Message *)in_stack_fffffffffffff9d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      std::__cxx11::string::~string(local_348);
      testing::Message::~Message((Message *)0xf53151);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf531e8);
    fclose(local_160);
    this_00 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff958,0);
    local_360 = this_00;
    assertion_result =
         HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueKey(in_stack_fffffffffffff968,(int)((ulong)in_stack_fffffffffffff960 >> 0x20));
    local_3b8 = assertion_result;
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)kVar2,(key_type *)kVar3);
    expression_text =
         google::
         sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         ::operator*((sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)0xf5327b);
    testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
              (in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
               (pair<int,_int> *)in_stack_fffffffffffff968,
               (pair<int,_int> *)in_stack_fffffffffffff960);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_358);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff990);
      in_stack_fffffffffffff9c8 =
           testing::AssertionResult::failure_message((AssertionResult *)0xf532f2);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff990,TVar7,(char *)in_stack_fffffffffffff980,
                 (int)((ulong)in_stack_fffffffffffff978 >> 0x20),(char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      testing::Message::~Message((Message *)0xf5334f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf533c0);
    expected_predicate_value =
         HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject(in_stack_fffffffffffff958,0);
    local_3e0 = expected_predicate_value;
    local_438 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff968,
                            (int)((ulong)in_stack_fffffffffffff960 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)kVar2,(key_type *)kVar3);
    google::
    sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)0xf53438);
    testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
              (in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
               (pair<int,_int> *)in_stack_fffffffffffff968,
               (pair<int,_int> *)in_stack_fffffffffffff960);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3d8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff990);
      testing::AssertionResult::failure_message((AssertionResult *)0xf534af);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff990,TVar7,(char *)in_stack_fffffffffffff980,
                 (int)((ulong)in_stack_fffffffffffff978 >> 0x20),(char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      testing::Message::~Message((Message *)0xf5350c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf5357d);
    local_464 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffff968,
                            (int)((ulong)in_stack_fffffffffffff960 >> 0x20));
    sVar4 = google::
            BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::count(in_stack_fffffffffffff960,(key_type *)in_stack_fffffffffffff958);
    local_459 = sVar4 == 0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff960,(bool *)in_stack_fffffffffffff958,
               (type *)0xf535e8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_458);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff990);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)assertion_result,(char *)expression_text,
                 in_stack_fffffffffffff9c8,(char *)expected_predicate_value);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff990,TVar7,(char *)in_stack_fffffffffffff980,
                 (int)((ulong)in_stack_fffffffffffff978 >> 0x20),(char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      std::__cxx11::string::~string(local_498);
      testing::Message::~Message((Message *)0xf536bd);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf53754);
    this_01 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff958,0);
    local_4b0 = this_01;
    kVar5 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff968,(int)((ulong)in_stack_fffffffffffff960 >> 0x20));
    local_508 = kVar5;
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find((BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)kVar2,(key_type *)kVar3);
    TVar7 = kVar5.second;
    file = google::
           sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           ::operator*((sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)0xf537cc);
    testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
              (in_stack_fffffffffffff978,(char *)in_stack_fffffffffffff970,
               (pair<int,_int> *)in_stack_fffffffffffff968,
               (pair<int,_int> *)in_stack_fffffffffffff960);
    line = (int)((ulong)in_stack_fffffffffffff978 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4a8);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0xf53843);
      line = (int)((ulong)pcVar6 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_01,TVar7,(char *)file,line,(char *)in_stack_fffffffffffff970);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      testing::Message::~Message((Message *)0xf538a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf53911);
    kVar2 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffff968,(int)((ulong)in_stack_fffffffffffff960 >> 0x20));
    this_02 = (HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               *)google::
                 BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ::count(in_stack_fffffffffffff960,(key_type *)in_stack_fffffffffffff958);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff960,(bool *)in_stack_fffffffffffff958,
               (type *)0xf5397c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_528);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)assertion_result,(char *)expression_text,
                 in_stack_fffffffffffff9c8,(char *)expected_predicate_value);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_01,TVar7,(char *)file,line,(char *)kVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff960);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffa98);
      testing::Message::~Message((Message *)0xf53a51);
    }
    index = (int)((ulong)in_stack_fffffffffffff960 >> 0x20);
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf53ae8);
    kVar3 = HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(this_02,index);
    local_584 = kVar3;
    success = (bool *)google::
                      BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::count((BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)kVar3,(key_type *)in_stack_fffffffffffff958);
    local_579 = success == (bool *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)kVar3,success,(type *)0xf53b51);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_578);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)assertion_result,(char *)expression_text,
                 in_stack_fffffffffffff9c8,(char *)expected_predicate_value);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_01,TVar7,(char *)file,line,(char *)kVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)assertion_result);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)kVar3);
      std::__cxx11::string::~string(local_5b8);
      testing::Message::~Message((Message *)0xf53c26);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf53cba);
    google::
    HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashSet
              ((HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf53cc7);
    google::
    HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashSet
              ((HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf53cd4);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Serialization) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.serialize(ValueSerializer(), fp));
  rewind(fp);

  TypeParam ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.unserialize(ValueSerializer(), fp));
  fclose(fp);

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}